

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  DecimalQuantity *this_00;
  short sVar1;
  bool bVar2;
  int iVar3;
  UFormattedNumberData data;
  UnicodeString UStack_1c8;
  UFormattedNumberData local_188;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &local_188.quantity;
    local_188.fMagic = 0x46444e00;
    DecimalQuantity::DecimalQuantity(this_00);
    NumberStringBuilder::NumberStringBuilder(&local_188.string);
    Formattable::populateDecimalQuantity(obj,this_00,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
       (LocalizedNumberFormatter::formatImpl(&this->fFormatter,&local_188,status),
       *status < U_ILLEGAL_ARGUMENT_ERROR)) {
      pos->fBeginIndex = 0;
      pos->fEndIndex = 0;
      bVar2 = NumberStringBuilder::nextFieldPosition(&local_188.string,pos,status);
      if (bVar2) {
        sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (appendTo->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        if (iVar3 != 0) {
          pos->fBeginIndex = pos->fBeginIndex + iVar3;
          sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar3 = (appendTo->fUnion).fFields.fLength;
          }
          else {
            iVar3 = (int)sVar1 >> 5;
          }
          pos->fEndIndex = pos->fEndIndex + iVar3;
        }
      }
      NumberStringBuilder::toTempUnicodeString(&UStack_1c8,&local_188.string);
      if (-1 < UStack_1c8.fUnion.fStackFields.fLengthAndFlags) {
        UStack_1c8.fUnion.fFields.fLength = (int)UStack_1c8.fUnion.fStackFields.fLengthAndFlags >> 5
        ;
      }
      UnicodeString::doAppend(appendTo,&UStack_1c8,0,UStack_1c8.fUnion.fFields.fLength);
      UnicodeString::~UnicodeString(&UStack_1c8);
    }
    NumberStringBuilder::~NumberStringBuilder(&local_188.string);
    DecimalQuantity::~DecimalQuantity(this_00);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPosition& pos, UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    // always return first occurrence:
    pos.setBeginIndex(0);
    pos.setEndIndex(0);
    bool found = data.string.nextFieldPosition(pos, status);
    if (found && appendTo.length() != 0) {
        pos.setBeginIndex(pos.getBeginIndex() + appendTo.length());
        pos.setEndIndex(pos.getEndIndex() + appendTo.length());
    }
    appendTo.append(data.string.toTempUnicodeString());
    return appendTo;
}